

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.cpp
# Opt level: O2

void boost::filesystem::detail::directory_iterator_increment(directory_iterator *it,error_code *ec)

{
  dirent64 *__entry;
  DIR *__dirp;
  uint uVar1;
  type pdVar2;
  type pdVar3;
  long lVar4;
  dirent64 *pdVar5;
  perms *ppVar6;
  error_category *peVar7;
  filesystem_error *this;
  error_code eVar8;
  file_type local_bc;
  file_type local_b8;
  perms local_b4;
  perms local_b0;
  allocator<char> local_a9;
  uint *local_a8;
  path error_path;
  string_type filename;
  file_status local_60;
  file_status local_58;
  string local_50;
  
  if ((it->m_imp).px == (element_type *)0x0) {
    __assert_fail("(it.m_imp.get())&&(\"attempt to increment end iterator\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Naios[P]boost-minimal-dist/libs/filesystem/src/operations.cpp"
                  ,0x8f5,
                  "void boost::filesystem::detail::directory_iterator_increment(directory_iterator &, system::error_code *)"
                 );
  }
  pdVar2 = shared_ptr<boost::filesystem::detail::dir_itr_imp>::operator->(&it->m_imp);
  if (pdVar2->handle == (void *)0x0) {
    __assert_fail("(it.m_imp->handle != 0)&&(\"internal program error\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Naios[P]boost-minimal-dist/libs/filesystem/src/operations.cpp"
                  ,0x8f6,
                  "void boost::filesystem::detail::directory_iterator_increment(directory_iterator &, system::error_code *)"
                 );
  }
  filename._M_dataplus._M_p = (pointer)&filename.field_2;
  filename._M_string_length = 0;
  filename.field_2._M_local_buf[0] = '\0';
  local_b0 = perms_not_known;
  local_b4 = perms_not_known;
  system::system_category();
  local_b8 = status_error;
  local_bc = status_error;
  do {
    pdVar2 = shared_ptr<boost::filesystem::detail::dir_itr_imp>::operator->(&it->m_imp);
    pdVar3 = shared_ptr<boost::filesystem::detail::dir_itr_imp>::operator->(&it->m_imp);
    __entry = (dirent64 *)pdVar3->buffer;
    if (__entry == (dirent64 *)0x0) {
      __assert_fail("buffer != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/Naios[P]boost-minimal-dist/libs/filesystem/src/operations.cpp"
                    ,0x825,
                    "error_code (anonymous namespace)::dir_itr_increment(void *&, void *&, string &, fs::file_status &, fs::file_status &)"
                   );
    }
    __dirp = (DIR *)pdVar2->handle;
    local_a8 = (uint *)__errno_location();
    *local_a8 = 0;
    lVar4 = sysconf(0x44);
    if (lVar4 < 0) {
      error_path.m_pathname._M_dataplus._M_p = (pointer)0x0;
      pdVar5 = readdir64(__dirp);
      if (pdVar5 == (dirent64 *)0x0) {
        uVar1 = *local_a8;
        goto LAB_0010e1f9;
      }
      strcpy(__entry->d_name,pdVar5->d_name);
      error_path.m_pathname._M_dataplus._M_p = (pointer)__entry;
LAB_0010e241:
      std::__cxx11::string::assign((char *)&filename);
      switch(__entry->d_type >> 1 | __entry->d_type << 7) {
      default:
        local_b8 = status_error;
        break;
      case '\x02':
        local_b8 = directory_file;
        break;
      case '\x04':
        local_b8 = regular_file;
        break;
      case '\x05':
        local_b0 = perms_not_known;
        local_bc = status_error;
        local_b8 = symlink_file;
        ppVar6 = &local_b4;
        goto LAB_0010e2cb;
      }
      local_b4 = perms_not_known;
      ppVar6 = &local_b0;
      local_bc = local_b8;
LAB_0010e2cb:
      *ppVar6 = perms_not_known;
      uVar1 = (anonymous_namespace)::ok;
    }
    else {
      uVar1 = readdir64_r(__dirp,__entry,(dirent64 **)&error_path);
LAB_0010e1f9:
      if (uVar1 == 0) {
        if (error_path.m_pathname._M_dataplus._M_p != (pointer)0x0) goto LAB_0010e241;
        eVar8 = dir_itr_close(&pdVar2->handle,&pdVar3->buffer);
        uVar1 = eVar8.m_val;
      }
      else {
        uVar1 = *local_a8;
        system::system_category();
      }
    }
    if (uVar1 != 0) {
      pdVar2 = shared_ptr<boost::filesystem::detail::dir_itr_imp>::operator->(&it->m_imp);
      path::parent_path(&error_path,(path *)pdVar2);
      shared_ptr<boost::filesystem::detail::dir_itr_imp>::reset(&it->m_imp);
      if (ec == (error_code *)0x0) {
        this = (filesystem_error *)__cxa_allocate_exception(0x50);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_50,"boost::filesystem::directory_iterator::operator++",&local_a9
                  );
        uVar1 = *local_a8;
        peVar7 = system::system_category();
        eVar8._4_4_ = 0;
        eVar8.m_val = uVar1;
        eVar8.m_cat = peVar7;
        filesystem_error::filesystem_error(this,&local_50,&error_path,eVar8);
        __cxa_throw(this,&filesystem_error::typeinfo,filesystem_error::~filesystem_error);
      }
      uVar1 = *local_a8;
      peVar7 = system::system_category();
      ec->m_val = uVar1;
      ec->m_cat = peVar7;
      goto LAB_0010e3d1;
    }
    if (ec != (error_code *)0x0) {
      system::error_code::clear(ec);
    }
    pdVar2 = shared_ptr<boost::filesystem::detail::dir_itr_imp>::operator->(&it->m_imp);
    if (pdVar2->handle == (void *)0x0) {
      shared_ptr<boost::filesystem::detail::dir_itr_imp>::reset(&it->m_imp);
      goto LAB_0010e3e5;
    }
  } while ((*filename._M_dataplus._M_p == '.') &&
          ((filename._M_string_length == 1 ||
           ((filename._M_string_length == 2 && (filename._M_dataplus._M_p[1] == '.'))))));
  pdVar2 = shared_ptr<boost::filesystem::detail::dir_itr_imp>::operator->(&it->m_imp);
  std::__cxx11::string::string((string *)&error_path,(string *)&filename);
  local_58.m_value = local_bc;
  local_58.m_perms = local_b0;
  local_60.m_value = local_b8;
  local_60.m_perms = local_b4;
  directory_entry::replace_filename(&pdVar2->dir_entry,&error_path,&local_58,&local_60);
LAB_0010e3d1:
  std::__cxx11::string::~string((string *)&error_path);
LAB_0010e3e5:
  std::__cxx11::string::~string((string *)&filename);
  return;
}

Assistant:

void directory_iterator_increment(directory_iterator& it,
    system::error_code* ec)
  {
    BOOST_ASSERT_MSG(it.m_imp.get(), "attempt to increment end iterator");
    BOOST_ASSERT_MSG(it.m_imp->handle != 0, "internal program error");
    
    path::string_type filename;
    file_status file_stat, symlink_file_stat;
    system::error_code temp_ec;

    for (;;)
    {
      temp_ec = dir_itr_increment(it.m_imp->handle,
#       if defined(BOOST_POSIX_API)
        it.m_imp->buffer,
#       endif
        filename, file_stat, symlink_file_stat);

      if (temp_ec)  // happens if filesystem is corrupt, such as on a damaged optical disc
      {
        path error_path(it.m_imp->dir_entry.path().parent_path());  // fix ticket #5900
        it.m_imp.reset();
        if (ec == 0)
          BOOST_FILESYSTEM_THROW(
            filesystem_error("boost::filesystem::directory_iterator::operator++",
              error_path,
              error_code(BOOST_ERRNO, system_category())));
        ec->assign(BOOST_ERRNO, system_category());
        return;
      }
      else if (ec != 0) ec->clear();

      if (it.m_imp->handle == 0)  // eof, make end
      {
        it.m_imp.reset();
        return;
      }

      if (!(filename[0] == dot // !(dot or dot-dot)
        && (filename.size()== 1
          || (filename[1] == dot
            && filename.size()== 2))))
      {
        it.m_imp->dir_entry.replace_filename(
          filename, file_stat, symlink_file_stat);
        return;
      }
    }
  }